

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_int>::updateHandle
          (btAxisSweep3Internal<unsigned_int> *this,uint handle,btVector3 *aabbMin,
          btVector3 *aabbMax,btDispatcher *dispatcher)

{
  uint uVar1;
  uint uVar2;
  Handle *pHVar3;
  int iVar4;
  int iVar5;
  btAxisSweep3Internal<unsigned_int> *in_RCX;
  uint *in_RDX;
  uint in_ESI;
  btAxisSweep3Internal<unsigned_int> *in_RDI;
  undefined8 in_R8;
  btAxisSweep3Internal<unsigned_int> *unaff_retaddr;
  int dmax;
  int dmin;
  uint emax;
  uint emin;
  int axis;
  uint max [3];
  uint min [3];
  Handle *pHandle;
  int local_4c;
  uint local_48 [5];
  undefined1 in_stack_ffffffffffffffcf;
  undefined4 in_stack_fffffffffffffff0;
  btAxisSweep3Internal<unsigned_int> *pbVar6;
  
  pbVar6 = in_RDI;
  pHVar3 = getHandle(in_RDI,in_ESI);
  quantize((btAxisSweep3Internal<unsigned_int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
           (btVector3 *)in_RCX,(int)((ulong)in_R8 >> 0x20));
  quantize((btAxisSweep3Internal<unsigned_int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
           (btVector3 *)in_RCX,(int)((ulong)in_R8 >> 0x20));
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    uVar1 = *(uint *)((long)(&(pHVar3->super_btBroadphaseProxy).m_aabbMax + 1) + (long)local_4c * 4)
    ;
    uVar2 = pHVar3->m_maxEdges[local_4c];
    iVar4 = local_48[(long)local_4c + 3] - in_RDI->m_pEdges[local_4c][uVar1].m_pos;
    iVar5 = local_48[local_4c] - in_RDI->m_pEdges[local_4c][uVar2].m_pos;
    in_RDI->m_pEdges[local_4c][uVar1].m_pos = local_48[(long)local_4c + 3];
    in_RDI->m_pEdges[local_4c][uVar2].m_pos = local_48[local_4c];
    if (iVar4 < 0) {
      sortMinDown(in_RCX,(int)((ulong)in_R8 >> 0x20),(uint)in_R8,(btDispatcher *)pHVar3,
                  (bool)in_stack_ffffffffffffffcf);
    }
    if (0 < iVar5) {
      sortMaxUp(unaff_retaddr,(int)((ulong)pbVar6 >> 0x20),(uint)pbVar6,
                (btDispatcher *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                SUB81((ulong)in_RDX >> 0x38,0));
    }
    if (0 < iVar4) {
      sortMinUp(unaff_retaddr,(int)((ulong)pbVar6 >> 0x20),(uint)pbVar6,
                (btDispatcher *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                SUB81((ulong)in_RDX >> 0x38,0));
    }
    if (iVar5 < 0) {
      sortMaxDown((btAxisSweep3Internal<unsigned_int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  (int)((ulong)in_RDX >> 0x20),(uint)in_RDX,(btDispatcher *)in_RCX,
                  SUB81((ulong)in_R8 >> 0x38,0));
    }
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::updateHandle(BP_FP_INT_TYPE handle, const btVector3& aabbMin,const btVector3& aabbMax,btDispatcher* dispatcher)
{
//	btAssert(bounds.IsFinite());
	//btAssert(bounds.HasVolume());

	Handle* pHandle = getHandle(handle);

	// quantize the new bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// update changed edges
	for (int axis = 0; axis < 3; axis++)
	{
		BP_FP_INT_TYPE emin = pHandle->m_minEdges[axis];
		BP_FP_INT_TYPE emax = pHandle->m_maxEdges[axis];

		int dmin = (int)min[axis] - (int)m_pEdges[axis][emin].m_pos;
		int dmax = (int)max[axis] - (int)m_pEdges[axis][emax].m_pos;

		m_pEdges[axis][emin].m_pos = min[axis];
		m_pEdges[axis][emax].m_pos = max[axis];

		// expand (only adds overlaps)
		if (dmin < 0)
			sortMinDown(axis, emin,dispatcher,true);

		if (dmax > 0)
			sortMaxUp(axis, emax,dispatcher,true);

		// shrink (only removes overlaps)
		if (dmin > 0)
			sortMinUp(axis, emin,dispatcher,true);

		if (dmax < 0)
			sortMaxDown(axis, emax,dispatcher,true);

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE
	}

	
}